

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

predictor * __thiscall
Search::predictor::add_to<float>
          (predictor *this,v_array<float> *A,bool *A_is_ptr,float *a,size_t count,bool clear_first)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  float *old_pointer;
  size_t __n;
  
  pfVar1 = A->_begin;
  pfVar2 = A->_end;
  __n = (long)pfVar2 - (long)pfVar1;
  if (__n == 0) {
    if (pfVar2 != (float *)0x0 && *A_is_ptr == false) {
      free(pfVar1);
    }
    pfVar1 = a + count;
    if (a == (float *)0x0) {
      pfVar1 = (float *)0x0;
    }
    A->_begin = a;
    A->_end = pfVar1;
    A->end_array = pfVar1;
    *A_is_ptr = true;
  }
  else if (*A_is_ptr == false) {
    if (clear_first) {
      v_array<float>::clear(A);
    }
    if (a != (float *)0x0) {
      push_many<float>(A,a,count);
    }
  }
  else {
    if (clear_first) {
      A->_end = pfVar1;
      __n = 0;
      lVar3 = 0;
    }
    else {
      lVar3 = (long)pfVar2 - (long)pfVar1 >> 2;
    }
    pfVar2 = calloc_or_throw<float>(lVar3 + count);
    A->_begin = pfVar2;
    A->_end = pfVar2 + lVar3 + count;
    A->end_array = pfVar2 + lVar3 + count;
    memcpy(pfVar2,pfVar1,__n);
    *A_is_ptr = false;
    if (a != (float *)0x0) {
      memcpy(A->_begin + lVar3,a,count << 2);
    }
  }
  return this;
}

Assistant:

predictor& predictor::add_to(v_array<T>& A, bool& A_is_ptr, T* a, size_t count, bool clear_first)
{
  size_t old_size = A.size();
  if (old_size > 0)
  {
    if (A_is_ptr)  // we need to make our own memory
    {
      if (clear_first)
      {
        A.end() = A.begin();
        old_size = 0;
      }
      size_t new_size = old_size + count;
      make_new_pointer<T>(A, new_size);
      A_is_ptr = false;
      if (a != nullptr)
        memcpy(A.begin() + old_size, a, count * sizeof(T));
    }
    else  // we already have our own memory
    {
      if (clear_first)
        A.clear();
      if (a != nullptr)
        push_many<T>(A, a, count);
    }
  }
  else  // old_size == 0, clear_first is irrelevant
  {
    if (!A_is_ptr)
      A.delete_v();  // avoid memory leak

    A.begin() = a;
    if (a != nullptr)  // a is not nullptr
      A.end() = a + count;
    else
      A.end() = a;
    A.end_array = A.end();
    A_is_ptr = true;
  }
  return *this;
}